

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

int google::protobuf::internal::TcParser::FieldNumber(TcParseTableBase *table,FieldEntry *entry)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ushort *puVar5;
  uint uVar6;
  ushort *puVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  
  lVar4 = ((long)((long)entry - ((long)&table->has_bits_offset + (ulong)table->field_entries_offset)
                 ) >> 2) * -0x5555555555555555;
  if (table->skipmap32 != 0xffffffff) {
    uVar2 = ~table->skipmap32;
LAB_00fb6444:
    bVar9 = lVar4 != 0;
    lVar4 = lVar4 + -1;
    if (bVar9) goto code_r0x00fb644a;
    iVar3 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
      }
    }
    iVar3 = iVar3 + 1;
    bVar9 = true;
    lVar4 = 0;
    goto LAB_00fb6462;
  }
LAB_00fb6453:
  iVar3 = 0;
  bVar9 = false;
LAB_00fb6462:
  if (!bVar9) {
    puVar7 = (ushort *)((long)&table->has_bits_offset + (ulong)table->lookup_table_offset);
    do {
      if ((*puVar7 == 0xffff) && (puVar7[1] == 0xffff)) {
        bVar9 = true;
        goto LAB_00fb6519;
      }
      puVar5 = puVar7 + 3;
      uVar1 = puVar7[2];
      bVar9 = uVar1 != 0;
      iVar8 = iVar3;
      if (bVar9) {
        uVar2 = 0;
        do {
          if (*puVar5 != 0xffff) {
            uVar6 = (uint)(ushort)~*puVar5;
LAB_00fb64c7:
            bVar10 = lVar4 != 0;
            lVar4 = lVar4 + -1;
            if (bVar10) goto code_r0x00fb64cd;
            iVar8 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
              }
            }
            iVar8 = uVar2 * 0x10 + CONCAT22(puVar7[1],*puVar7) + iVar8;
            bVar10 = true;
            lVar4 = 0;
            goto LAB_00fb64ed;
          }
LAB_00fb64d9:
          iVar8 = 0;
          bVar10 = false;
LAB_00fb64ed:
          if (bVar10) break;
          puVar5 = puVar5 + 2;
          uVar2 = uVar2 + 1;
          bVar9 = uVar2 < uVar1;
          iVar8 = iVar3;
        } while (uVar2 != uVar1);
      }
      iVar3 = iVar8;
      puVar7 = puVar5;
    } while (!bVar9);
    bVar9 = false;
LAB_00fb6519:
    if (bVar9) {
      FieldNumber();
    }
  }
  return iVar3;
code_r0x00fb644a:
  uVar2 = uVar2 - 1 & uVar2;
  if (uVar2 == 0) goto LAB_00fb6453;
  goto LAB_00fb6444;
code_r0x00fb64cd:
  uVar6 = uVar6 - 1 & uVar6;
  if (uVar6 == 0) goto LAB_00fb64d9;
  goto LAB_00fb64c7;
}

Assistant:

int TcParser::FieldNumber(const TcParseTableBase* table,
                          const TcParseTableBase::FieldEntry* entry) {
  // The data structure was not designed to be queried in this direction, so
  // we have to do a linear search over the entries to see which one matches
  // while keeping track of the field number.
  // But it is fine because we are only using this for debug check messages.
  size_t need_to_skip = entry - table->field_entries_begin();
  const auto visit_bitmap = [&](uint32_t field_bitmap,
                                int base_field_number) -> absl::optional<int> {
    for (; field_bitmap != 0; field_bitmap &= field_bitmap - 1) {
      if (need_to_skip == 0) {
        return absl::countr_zero(field_bitmap) + base_field_number;
      }
      --need_to_skip;
    }
    return absl::nullopt;
  };
  if (auto number = visit_bitmap(~table->skipmap32, 1)) {
    return *number;
  }

  for (const uint16_t* lookup_table = table->field_lookup_begin();
       lookup_table[0] != 0xFFFF || lookup_table[1] != 0xFFFF;) {
    uint32_t fstart = lookup_table[0] | (lookup_table[1] << 16);
    lookup_table += 2;
    const uint16_t num_skip_entries = *lookup_table++;
    for (uint16_t i = 0; i < num_skip_entries; ++i) {
      // for each group of 16 fields we have: a
      // bitmap of 16 bits a 16-bit field-entry
      // offset for the first of them.
      if (auto number = visit_bitmap(static_cast<uint16_t>(~*lookup_table),
                                     fstart + 16 * i)) {
        return *number;
      }
      lookup_table += 2;
    }
  }
  Unreachable();
}